

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O0

double rapidjson::internal::StrtodNormalPrecision(double d,int p)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  
  if (in_EDI < -0x134) {
    dVar1 = FastPath(in_XMM0_Qa,in_EDI);
    dVar1 = FastPath(dVar1,in_EDI);
  }
  else {
    dVar1 = FastPath(in_XMM0_Qa,in_EDI);
  }
  return dVar1;
}

Assistant:

inline double StrtodNormalPrecision(double d, int p)
{ if (p < -308)
  { // Prevent expSum < -308, making Pow10(p) = 0
    d = FastPath(d, -308);
    d = FastPath(d, p + 308);
  }
  else
    d = FastPath(d, p);
  return d;
}